

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cornellbox.cpp
# Opt level: O3

void __thiscall CornellBox::_calculateGeometry(CornellBox *this)

{
  mat4 *ltw;
  vector<Triangle_*,_std::allocator<Triangle_*>_> *this_00;
  Triangle *pTVar1;
  Triangle *local_2a8;
  ColorRGB local_2a0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_290;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_280;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_270;
  ColorRGB local_260;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_250;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_240;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_230;
  ColorRGB local_220;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_210;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_200;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1f0;
  ColorRGB local_1e0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1d0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1c0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1b0;
  ColorRGB local_1a0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_190;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_180;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_170;
  ColorRGB local_160;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_150;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_140;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_130;
  ColorRGB local_120;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_110;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_100;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_f0;
  ColorRGB local_e0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_d0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_c0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_b0;
  ColorRGB local_a0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_90;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_80;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_70;
  ColorRGB local_60;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_50;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_40;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_30;
  
  *(undefined8 *)((long)&(this->v0).field_0 + 8) = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->v1).field_0 + 4) = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->v2).field_0 + 8) = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->v3).field_0 + 4) = 0x3f8000003f800000;
  *(undefined8 *)&(this->v4).field_0 = 0;
  *(undefined8 *)((long)&(this->v4).field_0 + 8) = 0x3f800000c0000000;
  *(undefined8 *)((long)&(this->v5).field_0 + 4) = 0xc000000000000000;
  *(undefined8 *)&(this->v0).field_0 = 0;
  *(undefined8 *)&(this->v6).field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->v6).field_0 + 8) = 0x3f800000c0000000;
  *(undefined8 *)&(this->l0).field_0 = 0x3f7d70a43ecccccd;
  *(undefined8 *)((long)&(this->l0).field_0 + 8) = 0x3f19999abf666666;
  *(undefined8 *)((long)&(this->l1).field_0 + 4) = 0xbf6666663f7d70a4;
  *(undefined8 *)&(this->v2).field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->v7).field_0 + 4) = 0xc00000003f800000;
  *(undefined8 *)&(this->l2).field_0 = 0x3f7d70a43ecccccd;
  *(undefined8 *)((long)&(this->l2).field_0 + 8) = 0x3f19999abf8ccccd;
  *(undefined8 *)((long)&(this->l3).field_0 + 4) = 0xbf8ccccd3f7d70a4;
  pTVar1 = (Triangle *)operator_new(0x60);
  local_30._0_8_ = 0;
  local_30.field_0.z = 1.0;
  local_40._0_8_ = 0;
  local_40.field_0.z = -2.0;
  local_50._0_8_ = 0x3f800000;
  local_50.field_0.z = 1.0;
  ColorRGB::ColorRGB(&local_60,0.5,0.5,0.4);
  ltw = &(this->super_SceneObject).localToWorld;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_30.field_0,(vec3 *)&local_40.field_0,
                     (vec3 *)&local_50.field_0,local_60);
  this_00 = &this->triangles;
  local_2a8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_2a8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_70._0_8_ = *(undefined8 *)&(this->v1).field_0;
  local_70.field_0.z = (this->v1).field_0.field_0.z;
  local_80._0_8_ = *(undefined8 *)&(this->v4).field_0;
  local_80.field_0.z = (this->v4).field_0.field_0.z;
  local_90._0_8_ = *(undefined8 *)&(this->v5).field_0;
  local_90.field_0.z = (this->v5).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_a0,0.5,0.5,0.4);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_70.field_0,(vec3 *)&local_80.field_0,
                     (vec3 *)&local_90.field_0,local_a0);
  local_2a8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_2a8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_b0._0_8_ = *(undefined8 *)&(this->v0).field_0;
  local_b0.field_0.z = (this->v0).field_0.field_0.z;
  local_c0._0_8_ = *(undefined8 *)&(this->v2).field_0;
  local_c0.field_0.z = (this->v2).field_0.field_0.z;
  local_d0._0_8_ = *(undefined8 *)&(this->v4).field_0;
  local_d0.field_0.z = (this->v4).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_e0,1.0,0.0,0.0);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_b0.field_0,(vec3 *)&local_c0.field_0,
                     (vec3 *)&local_d0.field_0,local_e0);
  local_2a8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_2a8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_f0._0_8_ = *(undefined8 *)&(this->v2).field_0;
  local_f0.field_0.z = (this->v2).field_0.field_0.z;
  local_100._0_8_ = *(undefined8 *)&(this->v6).field_0;
  local_100.field_0.z = (this->v6).field_0.field_0.z;
  local_110._0_8_ = *(undefined8 *)&(this->v4).field_0;
  local_110.field_0.z = (this->v4).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_120,1.0,0.0,0.0);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_f0.field_0,(vec3 *)&local_100.field_0,
                     (vec3 *)&local_110.field_0,local_120);
  local_2a8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_2a8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_130._0_8_ = *(undefined8 *)&(this->v1).field_0;
  local_130.field_0.z = (this->v1).field_0.field_0.z;
  local_140._0_8_ = *(undefined8 *)&(this->v5).field_0;
  local_140.field_0.z = (this->v5).field_0.field_0.z;
  local_150._0_8_ = *(undefined8 *)&(this->v3).field_0;
  local_150.field_0.z = (this->v3).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_160,0.0,1.0,0.0);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_130.field_0,(vec3 *)&local_140.field_0,
                     (vec3 *)&local_150.field_0,local_160);
  local_2a8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_2a8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_170._0_8_ = *(undefined8 *)&(this->v3).field_0;
  local_170.field_0.z = (this->v3).field_0.field_0.z;
  local_180._0_8_ = *(undefined8 *)&(this->v5).field_0;
  local_180.field_0.z = (this->v5).field_0.field_0.z;
  local_190._0_8_ = *(undefined8 *)&(this->v7).field_0;
  local_190.field_0.z = (this->v7).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_1a0,0.0,1.0,0.0);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_170.field_0,(vec3 *)&local_180.field_0,
                     (vec3 *)&local_190.field_0,local_1a0);
  local_2a8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_2a8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_1b0._0_8_ = *(undefined8 *)&(this->v2).field_0;
  local_1b0.field_0.z = (this->v2).field_0.field_0.z;
  local_1c0._0_8_ = *(undefined8 *)&(this->v3).field_0;
  local_1c0.field_0.z = (this->v3).field_0.field_0.z;
  local_1d0._0_8_ = *(undefined8 *)&(this->v6).field_0;
  local_1d0.field_0.z = (this->v6).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_1e0,0.5,0.5,0.4);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_1b0.field_0,(vec3 *)&local_1c0.field_0,
                     (vec3 *)&local_1d0.field_0,local_1e0);
  local_2a8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_2a8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_1f0._0_8_ = *(undefined8 *)&(this->v3).field_0;
  local_1f0.field_0.z = (this->v3).field_0.field_0.z;
  local_200._0_8_ = *(undefined8 *)&(this->v7).field_0;
  local_200.field_0.z = (this->v7).field_0.field_0.z;
  local_210._0_8_ = *(undefined8 *)&(this->v6).field_0;
  local_210.field_0.z = (this->v6).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_220,0.5,0.5,0.4);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_1f0.field_0,(vec3 *)&local_200.field_0,
                     (vec3 *)&local_210.field_0,local_220);
  local_2a8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_2a8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_230._0_8_ = *(undefined8 *)&(this->v4).field_0;
  local_230.field_0.z = (this->v4).field_0.field_0.z;
  local_240._0_8_ = *(undefined8 *)&(this->v6).field_0;
  local_240.field_0.z = (this->v6).field_0.field_0.z;
  local_250._0_8_ = *(undefined8 *)&(this->v5).field_0;
  local_250.field_0.z = (this->v5).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_260,0.5,0.5,0.4);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_230.field_0,(vec3 *)&local_240.field_0,
                     (vec3 *)&local_250.field_0,local_260);
  local_2a8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_2a8);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_270._0_8_ = *(undefined8 *)&(this->v5).field_0;
  local_270.field_0.z = (this->v5).field_0.field_0.z;
  local_280._0_8_ = *(undefined8 *)&(this->v6).field_0;
  local_280.field_0.z = (this->v6).field_0.field_0.z;
  local_290._0_8_ = *(undefined8 *)&(this->v7).field_0;
  local_290.field_0.z = (this->v7).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_2a0,0.5,0.5,0.4);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_270.field_0,(vec3 *)&local_280.field_0,
                     (vec3 *)&local_290.field_0,local_2a0);
  local_2a8 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_2a8);
  return;
}

Assistant:

void CornellBox::_calculateGeometry() {
    
    v0 = glm::vec3(0, 0, 1);
    v1 = glm::vec3(1, 0, 1);
    v2 = glm::vec3(0, 1, 1);
    v3 = glm::vec3(1, 1, 1);
    v4 = glm::vec3(0, 0, -2);
    v5 = glm::vec3(1, 0, -2);
    v6 = glm::vec3(0, 1, -2);
    v7 = glm::vec3(1, 1, -2);
    
    l0 = glm::vec3(0.4, 0.99, -0.9);
    l1 = glm::vec3(0.6, 0.99, -0.9);
    l2 = glm::vec3(0.4, 0.99, -1.1);
    l3 = glm::vec3(0.6, 0.99, -1.1);
    
    //bottom
    triangles.push_back(new Triangle(localToWorld, v0, v4, v1, ColorRGB(0.5, 0.5, 0.4)));
    triangles.push_back(new Triangle(localToWorld, v1, v4, v5, ColorRGB(0.5, 0.5, 0.4)));
    
    //left
    triangles.push_back(new Triangle(localToWorld, v0, v2, v4, ColorRGB(1.0, 0.0, 0.0)));
    triangles.push_back(new Triangle(localToWorld, v2, v6, v4, ColorRGB(1.0, 0.0, 0.0)));
    
    //right
    triangles.push_back(new Triangle(localToWorld, v1, v5, v3, ColorRGB(0.0, 1.0, 0.0)));
    triangles.push_back(new Triangle(localToWorld, v3, v5, v7, ColorRGB(0.0, 1.0, 0.0)));
    
    //top
    triangles.push_back(new Triangle(localToWorld, v2, v3, v6, ColorRGB(0.5, 0.5, 0.4)));
    triangles.push_back(new Triangle(localToWorld, v3, v7, v6, ColorRGB(0.5, 0.5, 0.4)));
    
    //back
    triangles.push_back(new Triangle(localToWorld, v4, v6, v5, ColorRGB(0.5, 0.5, 0.4)));
    triangles.push_back(new Triangle(localToWorld, v5, v6, v7, ColorRGB(0.5, 0.5, 0.4)));
    
    //light
//     triangles.push_back(new Triangle(localToWorld, l0, l2, l1, ColorRGB(1.0, 1.0, 1.0)));
//     triangles.push_back(new Triangle(localToWorld, l1, l2, l3, ColorRGB(1.0, 1.0, 1.0)));
}